

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_size_t ktxTexture2_GetDataSizeUncompressed(ktxTexture2 *This)

{
  uint uVar1;
  long lVar2;
  ktx_uint32_t kVar3;
  long in_RDI;
  float fVar4;
  ktx_size_t uncompressedLevelSize;
  ktx_int32_t level;
  ktxLevelIndexEntry *levelIndex;
  ktx_uint32_t uncompressedLevelAlignment;
  ktx_size_t uncompressedSize;
  undefined4 in_stack_ffffffffffffffc0;
  int local_2c;
  long local_18;
  ktx_size_t local_8;
  
  uVar1 = *(uint *)(in_RDI + 0x88);
  if (uVar1 < 2) {
    local_8 = *(ktx_size_t *)(in_RDI + 0x68);
  }
  else if (uVar1 - 2 < 2) {
    local_18 = 0;
    lVar2 = *(long *)(in_RDI + 0xa0);
    kVar3 = ktxTexture2_calcPostInflationLevelAlignment
                      ((ktxTexture2 *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
    local_2c = *(int *)(in_RDI + 0x34);
    while (local_2c = local_2c + -1, 0 < local_2c) {
      fVar4 = ceilf((float)*(ulong *)(lVar2 + 0x30 + (long)local_2c * 0x18) / (float)kVar3);
      local_18 = ((long)((float)kVar3 * fVar4) & 0xffffffffU) + local_18;
    }
    local_8 = *(long *)(lVar2 + 0x30) + local_18;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

ktx_size_t
ktxTexture2_GetDataSizeUncompressed(ktxTexture2* This)
{
    switch (This->supercompressionScheme) {
      case KTX_SS_BASIS_LZ:
      case KTX_SS_NONE:
        return This->dataSize;
      case KTX_SS_ZSTD:
      case KTX_SS_ZLIB:
      {
            ktx_size_t uncompressedSize = 0;
            ktx_uint32_t uncompressedLevelAlignment;
            ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

            uncompressedLevelAlignment =
                ktxTexture2_calcPostInflationLevelAlignment(This);

            for (ktx_int32_t level = This->numLevels - 1; level >= 1; level--) {
                ktx_size_t uncompressedLevelSize;
                uncompressedLevelSize = levelIndex[level].uncompressedByteLength;
                uncompressedLevelSize = _KTX_PADN(uncompressedLevelAlignment,
                                                  uncompressedLevelSize);
                uncompressedSize += uncompressedLevelSize;
            }
            uncompressedSize += levelIndex[0].uncompressedByteLength;
            return uncompressedSize;
      }
      case KTX_SS_BEGIN_VENDOR_RANGE:
      case KTX_SS_END_VENDOR_RANGE:
      case KTX_SS_BEGIN_RESERVED:
      default:
        return 0;
    }
}